

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationManagementPduHeader.h
# Opt level: O2

void __thiscall
DIS::SimulationManagementPduHeader::SimulationManagementPduHeader
          (SimulationManagementPduHeader *this,SimulationManagementPduHeader *param_2)

{
  undefined8 uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  uint uVar5;
  unsigned_short uVar6;
  
  this->_vptr_SimulationManagementPduHeader =
       (_func_int **)&PTR__SimulationManagementPduHeader_001c3098;
  (this->_pduHeader)._vptr_PduHeader = (_func_int **)&PTR__PduHeader_001c27b0;
  uVar2 = (param_2->_pduHeader)._exerciseID;
  uVar3 = (param_2->_pduHeader)._pduType;
  uVar4 = (param_2->_pduHeader)._protocolFamily;
  uVar5 = (param_2->_pduHeader)._timestamp;
  uVar1 = *(undefined8 *)((long)&(param_2->_pduHeader)._timestamp + 1);
  (this->_pduHeader)._protocolVersion = (param_2->_pduHeader)._protocolVersion;
  (this->_pduHeader)._exerciseID = uVar2;
  (this->_pduHeader)._pduType = uVar3;
  (this->_pduHeader)._protocolFamily = uVar4;
  (this->_pduHeader)._timestamp = uVar5;
  *(undefined8 *)((long)&(this->_pduHeader)._timestamp + 1) = uVar1;
  (this->_originatingID)._vptr_EntityID = (_func_int **)&PTR__EntityID_001c15b0;
  (this->_originatingID)._simulationAddress._vptr_SimulationAddress =
       (_func_int **)&PTR__SimulationAddress_001c2fb8;
  uVar6 = (param_2->_originatingID)._simulationAddress._application;
  (this->_originatingID)._simulationAddress._site =
       (param_2->_originatingID)._simulationAddress._site;
  (this->_originatingID)._simulationAddress._application = uVar6;
  (this->_originatingID)._entityNumber = (param_2->_originatingID)._entityNumber;
  (this->_recevingID)._vptr_EntityID = (_func_int **)&PTR__EntityID_001c15b0;
  (this->_recevingID)._simulationAddress._vptr_SimulationAddress =
       (_func_int **)&PTR__SimulationAddress_001c2fb8;
  uVar6 = (param_2->_recevingID)._simulationAddress._application;
  (this->_recevingID)._simulationAddress._site = (param_2->_recevingID)._simulationAddress._site;
  (this->_recevingID)._simulationAddress._application = uVar6;
  (this->_recevingID)._entityNumber = (param_2->_recevingID)._entityNumber;
  return;
}

Assistant:

class OPENDIS7_EXPORT SimulationManagementPduHeader
{
protected:
  /** Conventional PDU header */
  PduHeader _pduHeader; 

  /** IDs the simulation or entity, etiehr a simulation or an entity. Either 6.2.80 or 6.2.28 */
  EntityID _originatingID; 

  /** simulation, all simulations, a special ID, or an entity. See 5.6.5 and 5.12.4 */
  EntityID _recevingID; 


 public:
    SimulationManagementPduHeader();
    virtual ~SimulationManagementPduHeader();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    PduHeader& getPduHeader(); 
    const PduHeader&  getPduHeader() const; 
    void setPduHeader(const PduHeader    &pX);

    EntityID& getOriginatingID(); 
    const EntityID&  getOriginatingID() const; 
    void setOriginatingID(const EntityID    &pX);

    EntityID& getRecevingID(); 
    const EntityID&  getRecevingID() const; 
    void setRecevingID(const EntityID    &pX);


virtual int getMarshalledSize() const;

     bool operator  ==(const SimulationManagementPduHeader& rhs) const;
}